

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  memory_buf_t *in_RDI;
  uint unaff_retaddr;
  null_scoped_padder p;
  uint field_size;
  uint32_t pid;
  null_scoped_padder local_29;
  uint local_28;
  uint local_24;
  memory_buf_t *local_20;
  memory_buf_t *dest_00;
  
  local_20 = in_RCX;
  dest_00 = in_RDI;
  local_24 = os::pid();
  local_28 = null_scoped_padder::count_digits<unsigned_int>(local_24);
  null_scoped_padder::null_scoped_padder
            (&local_29,(ulong)local_28,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_20);
  fmt_helper::append_int<unsigned_int>(unaff_retaddr,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }